

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateFastInlineStringCodePointAt
          (Lowerer *this,Instr *lastInstr,Func *func,Opnd *strLength,Opnd *srcIndex,
          RegOpnd *lowerChar,RegOpnd *strPtr)

{
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  LabelInstr *target;
  AddrOpnd *pAVar8;
  Opnd *pOVar9;
  IntConstOpnd *pIVar10;
  RegOpnd *upperChar;
  Opnd *reg32Bit;
  IndirOpnd *pIStack_50;
  uint32 length;
  IndirOpnd *tempIndirOpnd;
  LabelInstr *labelCharCodeAt;
  RegOpnd *tempReg;
  RegOpnd *lowerChar_local;
  Opnd *srcIndex_local;
  Opnd *strLength_local;
  Func *func_local;
  Instr *lastInstr_local;
  Lowerer *this_local;
  
  IVar2 = IR::Opnd::GetType(strLength);
  if (IVar2 != TyUint32) {
    IVar2 = IR::Opnd::GetType(strLength);
    if (IVar2 != TyInt64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4d3a,
                         "(strLength->GetType() == TyUint32 || strLength->GetType() == TyMachReg)",
                         "strLength->GetType() == TyUint32 || strLength->GetType() == TyMachReg");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  IVar2 = IR::Opnd::GetType(srcIndex);
  if (IVar2 != TyVar) {
    bVar3 = IR::Opnd::IsAddrOpnd(srcIndex);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4d3b,"(srcIndex->GetType() == TyVar || srcIndex->IsAddrOpnd())",
                         "srcIndex->GetType() == TyVar || srcIndex->IsAddrOpnd()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  IVar2 = IR::Opnd::GetType(&lowerChar->super_Opnd);
  if (IVar2 != TyInt64) {
    IVar2 = IR::Opnd::GetType(&lowerChar->super_Opnd);
    if (IVar2 != TyUint32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4d3c,
                         "(lowerChar->GetType() == TyMachReg || lowerChar->GetType() == TyUint32)",
                         "lowerChar->GetType() == TyMachReg || lowerChar->GetType() == TyUint32");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  bVar3 = IR::Opnd::IsRegOpnd(&strPtr->super_Opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d3d,"(strPtr->IsRegOpnd())","strPtr->IsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pRVar7 = IR::RegOpnd::New(TyInt64,func);
  target = IR::LabelInstr::New(Label,func,false);
  bVar3 = IR::Opnd::IsAddrOpnd(srcIndex);
  if (bVar3) {
    pAVar8 = IR::Opnd::AsAddrOpnd(srcIndex);
    uVar4 = Js::TaggedInt::ToUInt32(pAVar8->m_address);
    pIVar10 = IR::IntConstOpnd::New((ulong)(uVar4 + 1),TyUint32,func,false);
    InsertCompareBranch(this,strLength,&pIVar10->super_Opnd,BrLe_A,true,target,lastInstr,false);
    pIStack_50 = IR::IndirOpnd::New(strPtr,(uVar4 + 1) * 2,TyUint16,func,false);
  }
  else {
    InsertMove(&pRVar7->super_Opnd,srcIndex,lastInstr,true);
    pOVar9 = IR::Opnd::UseWithNewType(&pRVar7->super_Opnd,TyInt32,func);
    InsertMove(&pRVar7->super_Opnd,pOVar9,lastInstr,true);
    labelCharCodeAt = (LabelInstr *)IR::Opnd::AsRegOpnd(pOVar9);
    pIVar10 = IR::IntConstOpnd::New(1,TyInt32,func,false);
    InsertAdd(false,(Opnd *)labelCharCodeAt,(Opnd *)labelCharCodeAt,&pIVar10->super_Opnd,lastInstr);
    InsertCompareBranch(this,strLength,(Opnd *)labelCharCodeAt,BrLe_A,true,target,lastInstr,false);
    iVar5 = IR::Opnd::GetSize((Opnd *)labelCharCodeAt);
    if (iVar5 != 8) {
      pOVar9 = IR::Opnd::UseWithNewType((Opnd *)labelCharCodeAt,TyUint64,func);
      labelCharCodeAt = (LabelInstr *)IR::Opnd::AsRegOpnd(pOVar9);
    }
    pIStack_50 = IR::IndirOpnd::New(strPtr,(RegOpnd *)labelCharCodeAt,'\x01',TyUint16,func);
  }
  pIVar10 = IR::IntConstOpnd::New(0xdc00,TyUint32,func,false);
  InsertCompareBranch(this,&lowerChar->super_Opnd,&pIVar10->super_Opnd,BrGe_A,target,lastInstr,false
                     );
  pIVar10 = IR::IntConstOpnd::New(0xd7ff,TyUint32,func,false);
  InsertCompareBranch(this,&lowerChar->super_Opnd,&pIVar10->super_Opnd,BrLe_A,target,lastInstr,false
                     );
  pRVar7 = IR::RegOpnd::New(TyInt32,func);
  InsertMove(&pRVar7->super_Opnd,&pIStack_50->super_Opnd,lastInstr,true);
  pIVar10 = IR::IntConstOpnd::New(0xe000,TyUint32,func,false);
  InsertCompareBranch(this,&pRVar7->super_Opnd,&pIVar10->super_Opnd,BrGe_A,target,lastInstr,false);
  pIVar10 = IR::IntConstOpnd::New(0xdbff,TyUint32,func,false);
  InsertCompareBranch(this,&pRVar7->super_Opnd,&pIVar10->super_Opnd,BrLe_A,target,lastInstr,false);
  pIVar10 = IR::IntConstOpnd::New(0xd800,TyUint32,func,false);
  InsertSub(false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pIVar10->super_Opnd,lastInstr);
  pIVar10 = IR::IntConstOpnd::New(10,TyUint32,func,false);
  InsertShift(Shl_A,false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pIVar10->super_Opnd,
              lastInstr);
  InsertAdd(false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pRVar7->super_Opnd,lastInstr);
  pIVar10 = IR::IntConstOpnd::New(0x2400,TyUint32,func,false);
  InsertAdd(false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pIVar10->super_Opnd,lastInstr);
  IR::Instr::InsertBefore(lastInstr,&target->super_Instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineStringCodePointAt(IR::Instr* lastInstr, Func* func, IR::Opnd *strLength, IR::Opnd *srcIndex, IR::RegOpnd *lowerChar, IR::RegOpnd *strPtr)
{
    //// Required State:
    // strLength - UInt32
    // srcIndex  - TyVar if not Address
    // lowerChar - TyMachReg
    // strPtr    - Addr
    //// Instructions
    //                  CMP [strLength], srcIndex + 1
    //                  JBE charCodeAt
    //                  CMP lowerChar 0xDC00
    //                  JGE charCodeAt
    //                  CMP lowerChar 0xD7FF
    //                  JLE charCodeAt
    // upperChar      = MOVZX [strPtr + srcIndex + 1]
    //                  CMP upperChar 0xE000
    //                  JGE charCodeAt
    //                  CMP lowerChar 0xDBFF
    //                  JLE charCodeAt
    // lowerChar      = SUB lowerChar - 0xD800
    // lowerChar      = SHL lowerChar, 10
    // lowerChar      = ADD lowerChar + upperChar
    // lowerChar      = ADD lowerChar + 0x2400
    // :charCodeAt
    // :done

    // Asserts
    // Arm should change to Uint32 for the strLength
    Assert(strLength->GetType() == TyUint32 || strLength->GetType() == TyMachReg);
    Assert(srcIndex->GetType() == TyVar || srcIndex->IsAddrOpnd());
    Assert(lowerChar->GetType() == TyMachReg || lowerChar->GetType() == TyUint32);
    Assert(strPtr->IsRegOpnd());

    IR::RegOpnd *tempReg = IR::RegOpnd::New(TyMachReg, func);
    IR::LabelInstr *labelCharCodeAt = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::IndirOpnd *tempIndirOpnd;

    if (srcIndex->IsAddrOpnd())
    {
        uint32 length = Js::TaggedInt::ToUInt32(srcIndex->AsAddrOpnd()->m_address) + 1U;
        InsertCompareBranch(strLength, IR::IntConstOpnd::New(length, TyUint32, func), Js::OpCode::BrLe_A, true, labelCharCodeAt, lastInstr);
        tempIndirOpnd = IR::IndirOpnd::New(strPtr, (length) * sizeof(char16), TyUint16, func);
    }
    else
    {
        InsertMove(tempReg, srcIndex, lastInstr);

#if INT32VAR
        IR::Opnd * reg32Bit = tempReg->UseWithNewType(TyInt32, func);
        InsertMove(tempReg, reg32Bit, lastInstr);
        tempReg = reg32Bit->AsRegOpnd();
#else
        InsertShift(Js::OpCode::Shr_A, false, tempReg, tempReg, IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, func), lastInstr);
#endif
        InsertAdd(false, tempReg, tempReg, IR::IntConstOpnd::New(1, TyInt32, func), lastInstr);

        InsertCompareBranch(strLength, tempReg, Js::OpCode::BrLe_A, true, labelCharCodeAt, lastInstr);

        if(tempReg->GetSize() != MachPtr)
        {
            tempReg = tempReg->UseWithNewType(TyMachPtr, func)->AsRegOpnd();
        }

        tempIndirOpnd = IR::IndirOpnd::New(strPtr, tempReg, 1, TyUint16, func);
    }

    // By this point, we have added instructions before labelCharCodeAt to check for extra length required for the surrogate pair
    // The branching for that is already handled, all we have to do now is to check for correct values.
    // Validate char is in range [D800, DBFF]; otherwise just get a charCodeAt
    InsertCompareBranch(lowerChar, IR::IntConstOpnd::New(0xDC00, TyUint32, func), Js::OpCode::BrGe_A, labelCharCodeAt, lastInstr);
    InsertCompareBranch(lowerChar, IR::IntConstOpnd::New(0xD7FF, TyUint32, func), Js::OpCode::BrLe_A, labelCharCodeAt, lastInstr);

    // upperChar      = MOVZX r3, [r1 + r3 * 2]  -- this is the value of the upper surrogate pair char
    IR::RegOpnd *upperChar = IR::RegOpnd::New(TyInt32, func);
    InsertMove(upperChar, tempIndirOpnd, lastInstr);

    // Validate upper is in range [DC00, DFFF]; otherwise just get a charCodeAt
    InsertCompareBranch(upperChar, IR::IntConstOpnd::New(0xE000, TyUint32, func), Js::OpCode::BrGe_A, labelCharCodeAt, lastInstr);
    InsertCompareBranch(upperChar, IR::IntConstOpnd::New(0xDBFF, TyUint32, func), Js::OpCode::BrLe_A, labelCharCodeAt, lastInstr);

    // (lower - 0xD800) << 10 + second - 0xDC00 + 0x10000 -- 0x10000 - 0xDC00 = 0x2400
    // lowerChar      = SUB lowerChar - 0xD800
    // lowerChar      = SHL lowerChar, 10
    // lowerChar      = ADD lowerChar + upperChar
    // lowerChar      = ADD lowerChar + 0x2400
    InsertSub(false, lowerChar, lowerChar, IR::IntConstOpnd::New(0xD800, TyUint32, func), lastInstr);
    InsertShift(Js::OpCode::Shl_A, false, lowerChar, lowerChar, IR::IntConstOpnd::New(10, TyUint32, func), lastInstr);
    InsertAdd(false, lowerChar, lowerChar, upperChar, lastInstr);
    InsertAdd(false, lowerChar, lowerChar, IR::IntConstOpnd::New(0x2400, TyUint32, func), lastInstr);

    lastInstr->InsertBefore(labelCharCodeAt);
}